

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

int __thiscall Buffer::Allocate(Buffer *this,string *FileName,int FileOff)

{
  size_t *psVar1;
  char *pcVar2;
  Block *this_00;
  pointer pcVar3;
  long lVar4;
  _List_node_base *p_Var5;
  ostream *poVar6;
  int iVar7;
  long *local_50 [2];
  long local_40 [2];
  
  p_Var5 = (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var5 == (_List_node_base *)&this->Empty_Block) {
    p_Var5 = (_List_node_base *)&this->Occupy_Block;
    do {
      p_Var5 = p_Var5->_M_next;
      if (p_Var5 == (_List_node_base *)&this->Occupy_Block) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Blocks are not enough!");
        std::endl<char,std::char_traits<char>>(poVar6);
        system("pause");
        exit(1);
      }
    } while (this->Pin[*(int *)&p_Var5[1]._M_next] != 0);
    iVar7 = *(int *)&p_Var5[1]._M_next;
    lVar4 = 0x2832028;
    if (this->Dirty[iVar7] != 1) goto LAB_00140ae6;
    Block::WriteFile(this->buffer + iVar7);
    lVar4 = 0x2832028;
  }
  else {
    lVar4 = 0x2832010;
  }
  iVar7 = *(int *)&p_Var5[1]._M_next;
LAB_00140ae6:
  pcVar2 = this->buffer[0].data + lVar4 + -0x24;
  *(long *)pcVar2 = *(long *)pcVar2 + -1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var5,0x18);
  this_00 = this->buffer + iVar7;
  std::__cxx11::string::_M_replace
            ((ulong)this_00,0,(char *)this->buffer[iVar7].FileName._M_string_length,0x1493a5);
  this->buffer[iVar7].FileOff = -1;
  memset(this->buffer[iVar7].data,0,0x2000);
  pcVar3 = (FileName->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + FileName->_M_string_length);
  std::__cxx11::string::_M_assign((string *)this_00);
  this_00->FileOff = FileOff;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  Block::ReadFile(this_00);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var5[1]._M_next = iVar7;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
  ;
  *psVar1 = *psVar1 + 1;
  this->Dirty[iVar7] = 0;
  this->Pin[iVar7] = 1;
  return iVar7;
}

Assistant:

int Buffer::Allocate(string FileName, int FileOff) {
	int pos;
	if (this->Empty_Block.empty()) {
		//û�пտ飬ֻ�ܸ���LRUԭ���滻
		list<int>::iterator it;
		for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end(); it++) {
			if (Pin[*it] == 0)	break;				//�ҵ���Զ�޸���û�������Ŀ�
		}
		if (it == this->Occupy_Block.end()) {
			cout << "Blocks are not enough!" << endl;
			system("pause");
			exit(1);
		}
		if (Dirty[*it] == 1) {
			this->buffer[*it].WriteFile();			//���޸ģ���д�ش���
		}
		pos = *it;
		it = this->Occupy_Block.erase(it);
	}
	else {
		//���пտ飬ȡ������
		pos = this->Empty_Block.front();
		this->Empty_Block.pop_front();
	}
	this->buffer[pos].BlockClear();					//��ոÿ�
	this->buffer[pos].BlockSet(FileName, FileOff);
	this->buffer[pos].ReadFile();
	this->Occupy_Block.push_back(pos);
	this->UnDirt(pos);
	this->Lock(pos);							//����������һ�θ��µ���֮ǰ���ñ��滻��ȥ
	return pos;
}